

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

CaseAssertionExpr * __thiscall
slang::BumpAllocator::
emplace<slang::ast::CaseAssertionExpr,slang::ast::Expression_const&,std::span<slang::ast::CaseAssertionExpr::ItemGroup,18446744073709551615ul>,slang::ast::AssertionExpr_const*&>
          (BumpAllocator *this,Expression *args,
          span<slang::ast::CaseAssertionExpr::ItemGroup,_18446744073709551615UL> *args_1,
          AssertionExpr **args_2)

{
  span<const_slang::ast::CaseAssertionExpr::ItemGroup,_18446744073709551615UL> items;
  Expression *expr;
  __extent_storage<18446744073709551615UL> in_RCX;
  AssertionExpr *in_RSI;
  size_t in_stack_ffffffffffffffc8;
  CaseAssertionExpr *in_stack_ffffffffffffffd0;
  pointer in_stack_ffffffffffffffd8;
  
  expr = (Expression *)
         allocate((BumpAllocator *)in_stack_ffffffffffffffd8,(size_t)in_stack_ffffffffffffffd0,
                  in_stack_ffffffffffffffc8);
  std::span<const_slang::ast::CaseAssertionExpr::ItemGroup,_18446744073709551615UL>::
  span<slang::ast::CaseAssertionExpr::ItemGroup,_18446744073709551615UL>
            ((span<const_slang::ast::CaseAssertionExpr::ItemGroup,_18446744073709551615UL> *)
             in_stack_ffffffffffffffd0,
             (span<slang::ast::CaseAssertionExpr::ItemGroup,_18446744073709551615UL> *)expr);
  items._M_extent._M_extent_value = in_RCX._M_extent_value;
  items._M_ptr = in_stack_ffffffffffffffd8;
  ast::CaseAssertionExpr::CaseAssertionExpr(in_stack_ffffffffffffffd0,expr,items,in_RSI);
  return (CaseAssertionExpr *)expr;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }